

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Line.h
# Opt level: O0

pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *
anurbs::Line<3L>::closest_point
          (pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *__return_storage_ptr__,Vector *point
          ,Vector *line_a,Vector *line_b,bool is_infinite)

{
  RealScalar RVar1;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>
  local_1a8;
  type local_190;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
  local_158;
  undefined1 local_110 [8];
  Vector closest_point;
  double local_f0;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>
  local_e8;
  ReturnType local_d0;
  double t;
  type local_c0;
  Matrix<double,1,3,1,1,3> local_a0 [8];
  Vector r;
  Vector o;
  double l;
  Matrix<double,1,3,1,1,3> local_48 [8];
  Vector v;
  bool is_infinite_local;
  Vector *line_b_local;
  Vector *line_a_local;
  Vector *point_local;
  
  v.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[2]._7_1_ =
       is_infinite;
  Eigen::MatrixBase<Eigen::Matrix<double,1,3,1,1,3>>::operator-
            ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>
              *)&l,(MatrixBase<Eigen::Matrix<double,1,3,1,1,3>> *)line_b,
             (MatrixBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)line_a);
  Eigen::Matrix<double,1,3,1,1,3>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,1,3,1,1,3>const,Eigen::Matrix<double,1,3,1,1,3>const>>
            (local_48,(EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                       *)&l);
  RVar1 = Eigen::MatrixBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>::squaredNorm
                    ((MatrixBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)local_48);
  if (1e-14 <= RVar1) {
    Eigen::Matrix<double,_1,_3,_1,_1,_3>::Matrix
              ((Matrix<double,_1,_3,_1,_1,_3> *)
               (r.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
                array + 2),line_a);
    t = 1.0 / RVar1;
    Eigen::MatrixBase<Eigen::Matrix<double,1,3,1,1,3>>::operator*
              (&local_c0,(MatrixBase<Eigen::Matrix<double,1,3,1,1,3>> *)local_48,&t);
    Eigen::Matrix<double,1,3,1,1,3>::
    Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,1,3,1,1,3>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const>>
              (local_a0,(EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
                         *)&local_c0);
    Eigen::MatrixBase<Eigen::Matrix<double,1,3,1,1,3>>::operator-
              (&local_e8,(MatrixBase<Eigen::Matrix<double,1,3,1,1,3>> *)point,
               (MatrixBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)
               (r.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
                array + 2));
    local_d0 = Eigen::
               MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,1,3,1,1,3>const,Eigen::Matrix<double,1,3,1,1,3>const>>
               ::dot<Eigen::Matrix<double,1,3,1,1,3>>
                         ((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,1,3,1,1,3>const,Eigen::Matrix<double,1,3,1,1,3>const>>
                           *)&local_e8,(MatrixBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)local_a0
                         );
    if (((v.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[2].
          _7_1_ & 1) != 0) || (0.0 <= local_d0)) {
      if (((v.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[2]
            ._7_1_ & 1) != 0) || (local_d0 <= 1.0)) {
        Eigen::MatrixBase<Eigen::Matrix<double,1,3,1,1,3>>::operator-
                  (&local_1a8,(MatrixBase<Eigen::Matrix<double,1,3,1,1,3>> *)line_b,
                   (MatrixBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)line_a);
        Eigen::operator*(&local_190,&local_d0,(StorageBaseType *)&local_1a8);
        Eigen::MatrixBase<Eigen::Matrix<double,1,3,1,1,3>>::operator+
                  (&local_158,(MatrixBase<Eigen::Matrix<double,1,3,1,1,3>> *)line_a,
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
                    *)&local_190);
        Eigen::Matrix<double,1,3,1,1,3>::
        Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,1,3,1,1,3>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,1,3,1,1,3>const,Eigen::Matrix<double,1,3,1,1,3>const>const>const>>
                  ((Matrix<double,1,3,1,1,3> *)local_110,
                   (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>_>
                    *)&local_158);
        std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>::
        pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_true>
                  (__return_storage_ptr__,&local_d0,(Matrix<double,_1,_3,_1,_1,_3> *)local_110);
      }
      else {
        closest_point.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
        array[2] = 1.0;
        std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>::pair<double,_true>
                  (__return_storage_ptr__,
                   closest_point.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                   m_storage.m_data.array + 2,line_b);
      }
    }
    else {
      local_f0 = 0.0;
      std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>::pair<double,_true>
                (__return_storage_ptr__,&local_f0,line_a);
    }
  }
  else {
    o.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[2] = 0.0;
    std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>::pair<double,_true>
              (__return_storage_ptr__,
               o.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
               + 2,line_a);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::pair<double, Vector> closest_point(const Vector& point, const Vector& line_a, const Vector& line_b, bool is_infinite=false)
    {
        const Vector v = line_b - line_a;
        const double l = v.squaredNorm();

        if (l < 1e-14) {
            return {0.0, line_a};
        }

        const Vector o = line_a;
        const Vector r = v * (1.0 / l);
        const double t = (point - o).dot(r);

        if (!is_infinite && t < 0) {
            return {0.0, line_a};
        }
        
        if (!is_infinite && t > 1) {
            return {1.0, line_b};
        }

        const Vector closest_point = line_a + t * (line_b - line_a);

        return {t, closest_point};
    }